

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O0

size_t __thiscall features::Sift::extrema_detection(Sift *this,ConstPtr *s,int oi,int si)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int index;
  ImageBase *pIVar7;
  element_type *peVar8;
  float *pfVar9;
  undefined1 local_8c [8];
  Keypoint kp;
  int i;
  int l;
  float center_value;
  bool smallest;
  int iStack_68;
  bool largest;
  int idx;
  int x;
  int y;
  int off;
  int detected;
  int noff [9];
  int h;
  int w;
  int si_local;
  int oi_local;
  ConstPtr *s_local;
  Sift *this_local;
  
  pIVar7 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(s + 1));
  iVar5 = core::ImageBase::width(pIVar7);
  pIVar7 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(s + 1));
  iVar6 = core::ImageBase::height(pIVar7);
  off = -1 - iVar5;
  detected = -iVar5;
  noff[0] = 1 - iVar5;
  noff[1] = -1;
  noff[2] = 0;
  noff[3] = 1;
  noff[4] = iVar5 + -1;
  noff[6] = iVar5 + 1;
  y = 0;
  x = iVar5;
  noff[5] = iVar5;
  for (idx = 1; idx < iVar6 + -1; idx = idx + 1) {
    for (iStack_68 = 1; iStack_68 < iVar5 + -1; iStack_68 = iStack_68 + 1) {
      index = x + iStack_68;
      bVar3 = true;
      bVar4 = true;
      peVar8 = std::
               __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(s + 1));
      pfVar9 = core::Image<float>::at(peVar8,index);
      fVar1 = *pfVar9;
      kp.y = 0.0;
      while( true ) {
        if ((bVar3) || (bVar2 = false, bVar4)) {
          bVar2 = (int)kp.y < 3;
        }
        if (!bVar2) break;
        kp.x = 0.0;
        while( true ) {
          if ((bVar3) || (bVar2 = false, bVar4)) {
            bVar2 = (int)kp.x < 9;
          }
          if (!bVar2) break;
          if ((kp.y != 1.4013e-45) || (kp.x != 5.60519e-45)) {
            peVar8 = std::
                     __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)(s + (int)kp.y));
            pfVar9 = core::Image<float>::at(peVar8,index + (&off)[(int)kp.x]);
            if (fVar1 <= *pfVar9) {
              bVar3 = false;
            }
            peVar8 = std::
                     __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)(s + (int)kp.y));
            pfVar9 = core::Image<float>::at(peVar8,index + (&off)[(int)kp.x]);
            if (*pfVar9 <= fVar1) {
              bVar4 = false;
            }
          }
          kp.x = (float)((int)kp.x + 1);
        }
        kp.y = (float)((int)kp.y + 1);
      }
      if ((bVar4) || (bVar3)) {
        kp.octave = (int)(float)iStack_68;
        kp.sample = (float)idx;
        local_8c._4_4_ = (undefined4)si;
        local_8c._0_4_ = oi;
        std::vector<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>::push_back
                  (&this->keypoints,(value_type *)local_8c);
        y = y + 1;
      }
    }
    x = iVar5 + x;
  }
  return (long)y;
}

Assistant:

std::size_t
Sift::extrema_detection (core::FloatImage::ConstPtr s[3], int oi, int si)
{
    int const w = s[1]->width();
    int const h = s[1]->height();

    /* Offsets for the 9-neighborhood w.r.t. center pixel. */
    int noff[9] = { -1 - w, 0 - w, 1 - w, -1, 0, 1, -1 + w, 0 + w, 1 + w };

    /*
     * Iterate over all pixels in s[1], and check if pixel is maximum
     * (or minumum) in its 27-neighborhood.
     */
    int detected = 0;
    int off = w;
    for (int y = 1; y < h - 1; ++y, off += w)
        for (int x = 1; x < w - 1; ++x)
        {
            int idx = off + x;

            bool largest = true;
            bool smallest = true;
            float center_value = s[1]->at(idx);
            for (int l = 0; (largest || smallest) && l < 3; ++l)
                for (int i = 0; (largest || smallest) && i < 9; ++i)
                {
                    if (l == 1 && i == 4) // Skip center pixel
                        continue;
                    if (s[l]->at(idx + noff[i]) >= center_value)
                        largest = false;
                    if (s[l]->at(idx + noff[i]) <= center_value)
                        smallest = false;
                }

            /* Skip non-maximum values. */
            if (!smallest && !largest)
                continue;

            /* Yummy. Add detected scale space extremum. */
            Keypoint kp;
            kp.octave = oi;
            kp.x = static_cast<float>(x);
            kp.y = static_cast<float>(y);
            kp.sample = static_cast<float>(si);
            this->keypoints.push_back(kp);
            detected += 1;
        }

    return detected;
}